

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O2

typed_value<std::vector<char,_std::allocator<char>_>,_char> * __thiscall
VW::config::options_boost_po::get_base_boost_value<char>
          (options_boost_po *this,shared_ptr<VW::config::typed_option<char>_> *opt)

{
  element_type *peVar1;
  typed_value<std::vector<char,_std::allocator<char>_>,_char> *ptVar2;
  initializer_list<char> __l;
  allocator_type local_3a;
  element_type local_39;
  _Vector_base<char,_std::allocator<char>_> local_38;
  
  ptVar2 = boost::program_options::value<std::vector<char,std::allocator<char>>>();
  peVar1 = (((opt->super___shared_ptr<VW::config::typed_option<char>,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->m_default_value).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    local_39 = *peVar1;
    __l._M_len = 1;
    __l._M_array = &local_39;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_38,__l,&local_3a);
    boost::program_options::typed_value<std::vector<char,_std::allocator<char>_>,_char>::
    default_value(ptVar2,(vector<char,_std::allocator<char>_> *)&local_38);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_38);
  }
  ptVar2 = add_notifier<char>(this,opt,ptVar2);
  ptVar2->m_composing = true;
  return ptVar2;
}

Assistant:

po::typed_value<std::vector<T>>* options_boost_po::get_base_boost_value(std::shared_ptr<typed_option<T>>& opt)
{
  auto value = po::value<std::vector<T>>();

  if (opt->default_value_supplied())
  {
    value->default_value({opt->default_value()});
  }

  return add_notifier(opt, value)->composing();
}